

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_test.c
# Opt level: O0

void test_req_ctx_send_twice(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int local_64;
  int i_2;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  int i_1;
  nng_err result__4;
  nng_err result__3;
  int i;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_msg *msg [2];
  nng_aio *aio [2];
  nng_ctx local_10;
  nng_socket local_c;
  nng_ctx ctx;
  nng_socket req;
  
  nVar1 = nng_req0_open(&local_c);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,800,"%s: expected success, got %s (%d)","nng_req0_open(&req)",pcVar3,nVar1
                        );
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(local_c,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0x321,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_ctx_open(&local_10,local_c);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0x322,"%s: expected success, got %s (%d)","nng_ctx_open(&ctx, req)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  result__4 = NNG_OK;
  while( true ) {
    if (1 < (int)result__4) {
      for (result__6 = NNG_OK; (int)result__6 < 2; result__6 = result__6 + NNG_EINTR) {
        nng_aio_set_msg((nng_aio *)msg[(long)(int)result__6 + 1],
                        *(nng_msg **)(&result__1 + (long)(int)result__6 * 2));
        nng_ctx_send(local_10,(nng_aio *)msg[(long)(int)result__6 + 1]);
        nuts_sleep(0x32);
      }
      nVar1 = nng_socket_close(local_c);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                             ,0x32f,"%s: expected success, got %s (%d)","nng_socket_close(req)",
                             pcVar3,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      nng_aio_wait((nng_aio *)msg[1]);
      nng_aio_wait(aio[0]);
      nVar1 = nng_aio_result((nng_aio *)msg[1]);
      pcVar3 = nng_strerror(NNG_ECANCELED);
      acutest_check_((uint)(nVar1 == NNG_ECANCELED),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                     ,0x332,"%s fails with %s","nng_aio_result(aio[0])",pcVar3);
      pcVar3 = nng_strerror(NNG_ECANCELED);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio[0])",pcVar3,0x14,
                       pcVar4,(ulong)nVar1);
      nVar1 = nng_aio_result(aio[0]);
      pcVar3 = nng_strerror(NNG_ECLOSED);
      acutest_check_((uint)(nVar1 == NNG_ECLOSED),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                     ,0x333,"%s fails with %s","nng_aio_result(aio[1])",pcVar3);
      pcVar3 = nng_strerror(NNG_ECLOSED);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio[1])",pcVar3,7,pcVar4,
                       (ulong)nVar1);
      for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
        nng_aio_free((nng_aio *)msg[(long)local_64 + 1]);
        nng_msg_free(*(nng_msg **)(&result__1 + (long)local_64 * 2));
      }
      return;
    }
    nVar1 = nng_aio_alloc((nng_aio **)(msg + (long)(int)result__4 + 1),(_func_void_void_ptr *)0x0,
                          (void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                           ,0x325,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio[i], NULL, NULL)",pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nVar1 = nng_msg_alloc((nng_msg **)(&result__1 + (long)(int)result__4 * 2),0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                           ,0x326,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg[i], 0)",
                           pcVar3,nVar1);
    if (iVar2 == 0) break;
    result__4 = result__4 + NNG_EINTR;
  }
  acutest_abort_();
}

Assistant:

static void
test_req_ctx_send_twice(void)
{
	nng_socket req;
	nng_ctx    ctx;
	nng_aio   *aio[2];
	nng_msg   *msg[2];

	NUTS_PASS(nng_req0_open(&req));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_ctx_open(&ctx, req));

	for (int i = 0; i < 2; i++) {
		NUTS_PASS(nng_aio_alloc(&aio[i], NULL, NULL));
		NUTS_PASS(nng_msg_alloc(&msg[i], 0));
	}

	for (int i = 0; i < 2; i++) {
		nng_aio_set_msg(aio[i], msg[i]);
		nng_ctx_send(ctx, aio[i]);
		NUTS_SLEEP(50);
	}

	NUTS_CLOSE(req);
	nng_aio_wait(aio[0]);
	nng_aio_wait(aio[1]);
	NUTS_FAIL(nng_aio_result(aio[0]), NNG_ECANCELED);
	NUTS_FAIL(nng_aio_result(aio[1]), NNG_ECLOSED);

	for (int i = 0; i < 2; i++) {
		nng_aio_free(aio[i]);
		nng_msg_free(msg[i]);
	}
}